

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
ghc::filesystem::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,path *p)

{
  char cVar1;
  undefined8 this;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_68;
  char c;
  iterator __end0;
  iterator __begin0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range2;
  allocator<char> local_39;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ps;
  path *p_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  ps.field_2._8_8_ = p;
  std::operator<<(os,"\"");
  this = ps.field_2._8_8_;
  std::allocator<char>::allocator();
  path::string<char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (path *)this,&local_39);
  std::allocator<char>::~allocator(&local_39);
  __end0._M_current = (char *)std::__cxx11::string::begin();
  _Stack_68._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff98);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end0);
    cVar1 = *pcVar3;
    if ((cVar1 == '\"') || (cVar1 == '\\')) {
      std::operator<<(os,'\\');
    }
    std::operator<<(os,cVar1);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end0);
  }
  std::operator<<(os,"\"");
  std::__cxx11::string::~string((string *)local_38);
  return os;
}

Assistant:

inline std::basic_ostream<charT, traits>& operator<<(std::basic_ostream<charT, traits>& os, const path& p)
{
    os << "\"";
    auto ps = p.string<charT, traits>();
    for (auto c : ps) {
        if (c == '"' || c == '\\') {
            os << '\\';
        }
        os << c;
    }
    os << "\"";
    return os;
}